

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

string * LinkedTag_to_seq_abi_cxx11_(LinkedTag tag,uint8_t k)

{
  byte in_DL;
  uint in_ESI;
  char cVar1;
  string *in_RDI;
  int shift;
  string *seq;
  int local_20;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_20 = (in_DL - 1) * 2; -1 < local_20; local_20 = local_20 + -2) {
    cVar1 = (char)in_RDI;
    switch(in_ESI >> ((byte)local_20 & 0x1f) & 3) {
    case 0:
      std::__cxx11::string::push_back(cVar1);
      break;
    case 1:
      std::__cxx11::string::push_back(cVar1);
      break;
    case 2:
      std::__cxx11::string::push_back(cVar1);
      break;
    case 3:
      std::__cxx11::string::push_back(cVar1);
    }
  }
  return in_RDI;
}

Assistant:

std::string LinkedTag_to_seq(LinkedTag tag, uint8_t k) {
    std::string seq;
    seq.reserve(k);
    for (int shift = (k - 1) * 2; shift >= 0; shift -= 2) {
//std::cout<<"kmer: "
        switch ((tag >> shift) % 4) {
            case 0:
                seq.push_back('A');
                break;
            case 1:
                seq.push_back('C');
                break;
            case 2:
                seq.push_back('G');
                break;
            case 3:
                seq.push_back('T');
                break;
        }
    }
    return seq;
}